

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O1

size_t HUF_readStats(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                    U32 *tableLogPtr,void *src,size_t srcSize)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  byte *pbVar9;
  bool bVar10;
  FSE_DTable aFStack_138 [68];
  
  sVar3 = 0xfffffffffffffffd;
  if (srcSize == 0) {
    return 0xfffffffffffffffd;
  }
  uVar7 = (ulong)*src;
  if ((char)*src < '\0') {
    uVar4 = uVar7 - 0x7e >> 1;
    if (srcSize <= uVar4) {
      return 0xfffffffffffffffd;
    }
    srcSize = uVar7 - 0x7f;
    sVar3 = 0xfffffffffffffffc;
    if (hwSize <= srcSize) {
      return 0xfffffffffffffffc;
    }
    if (srcSize != 0) {
      pbVar9 = (byte *)((long)src + 1);
      sVar3 = 0;
      do {
        huffWeight[sVar3] = *pbVar9 >> 4;
        huffWeight[sVar3 + 1] = *pbVar9 & 0xf;
        sVar3 = sVar3 + 2;
        pbVar9 = pbVar9 + 1;
      } while ((uint)sVar3 < (uint)srcSize);
    }
  }
  else {
    if (uVar7 < srcSize) {
      sVar3 = FSE_decompress_wksp(huffWeight,hwSize - 1,(void *)((long)src + 1),uVar7,aFStack_138,6)
      ;
      bVar10 = sVar3 < 0xfffffffffffffff8;
      srcSize = sVar3;
    }
    else {
      bVar10 = false;
    }
    uVar4 = uVar7;
    if (!bVar10) {
      return sVar3;
    }
  }
  rankStats[8] = 0;
  rankStats[9] = 0;
  rankStats[10] = 0;
  rankStats[0xb] = 0;
  rankStats[4] = 0;
  rankStats[5] = 0;
  rankStats[6] = 0;
  rankStats[7] = 0;
  rankStats[0] = 0;
  rankStats[1] = 0;
  rankStats[2] = 0;
  rankStats[3] = 0;
  rankStats[0xc] = 0;
  uVar5 = 0;
  bVar10 = srcSize != 0;
  if (bVar10) {
    bVar8 = *huffWeight;
    if (bVar8 < 0xc) {
      uVar5 = 0;
      uVar6 = 1;
      pbVar9 = huffWeight;
      do {
        rankStats[bVar8] = rankStats[bVar8] + 1;
        uVar5 = ((1 << (*pbVar9 & 0x1f)) >> 1) + uVar5;
        uVar7 = (ulong)uVar6;
        bVar10 = uVar7 < srcSize;
        if (srcSize <= uVar7) goto LAB_00181d32;
        pbVar9 = huffWeight + uVar7;
        bVar8 = huffWeight[uVar7];
        uVar6 = uVar6 + 1;
      } while (bVar8 < 0xc);
    }
    sVar3 = 0xfffffffffffffffc;
  }
LAB_00181d32:
  if (!bVar10) {
    if (uVar5 == 0) {
      sVar3 = 0xfffffffffffffffc;
    }
    else {
      uVar6 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      sVar2 = 0xfffffffffffffffc;
      if (uVar6 < 0xc) {
        uVar5 = (2 << ((byte)uVar6 & 0x1f)) - uVar5;
        uVar1 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        *tableLogPtr = 0x20 - (uVar6 ^ 0x1f);
        bVar10 = 1 << ((byte)uVar1 & 0x1f) == uVar5;
        if (bVar10) {
          uVar5 = 0x20 - (uVar1 ^ 0x1f);
          huffWeight[srcSize] = (BYTE)uVar5;
          rankStats[uVar5] = rankStats[uVar5] + 1;
          bVar10 = true;
          sVar2 = sVar3;
        }
      }
      else {
        bVar10 = false;
      }
      sVar3 = sVar2;
      if ((bVar10) && (sVar3 = 0xfffffffffffffffc, (rankStats[1] & 1) == 0 && 1 < rankStats[1])) {
        *nbSymbolsPtr = (int)srcSize + 1;
        sVar3 = uVar4 + 1;
      }
    }
  }
  return sVar3;
}

Assistant:

size_t HUF_readStats(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize)
{
    U32 weightTotal;
    const BYTE* ip = (const BYTE*) src;
    size_t iSize;
    size_t oSize;

    if (!srcSize) return ERROR(srcSize_wrong);
    iSize = ip[0];
    /* memset(huffWeight, 0, hwSize);   *//* is not necessary, even though some analyzer complain ... */

    if (iSize >= 128) {  /* special header */
        oSize = iSize - 127;
        iSize = ((oSize+1)/2);
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        if (oSize >= hwSize) return ERROR(corruption_detected);
        ip += 1;
        {   U32 n;
            for (n=0; n<oSize; n+=2) {
                huffWeight[n]   = ip[n/2] >> 4;
                huffWeight[n+1] = ip[n/2] & 15;
    }   }   }
    else  {   /* header compressed with FSE (normal case) */
        FSE_DTable fseWorkspace[FSE_DTABLE_SIZE_U32(6)];  /* 6 is max possible tableLog for HUF header (maybe even 5, to be tested) */
        if (iSize+1 > srcSize) return ERROR(srcSize_wrong);
        oSize = FSE_decompress_wksp(huffWeight, hwSize-1, ip+1, iSize, fseWorkspace, 6);   /* max (hwSize-1) values decoded, as last one is implied */
        if (FSE_isError(oSize)) return oSize;
    }

    /* collect weight stats */
    memset(rankStats, 0, (HUF_TABLELOG_MAX + 1) * sizeof(U32));
    weightTotal = 0;
    {   U32 n; for (n=0; n<oSize; n++) {
            if (huffWeight[n] >= HUF_TABLELOG_MAX) return ERROR(corruption_detected);
            rankStats[huffWeight[n]]++;
            weightTotal += (1 << huffWeight[n]) >> 1;
    }   }
    if (weightTotal == 0) return ERROR(corruption_detected);

    /* get last non-null symbol weight (implied, total must be 2^n) */
    {   U32 const tableLog = BIT_highbit32(weightTotal) + 1;
        if (tableLog > HUF_TABLELOG_MAX) return ERROR(corruption_detected);
        *tableLogPtr = tableLog;
        /* determine last weight */
        {   U32 const total = 1 << tableLog;
            U32 const rest = total - weightTotal;
            U32 const verif = 1 << BIT_highbit32(rest);
            U32 const lastWeight = BIT_highbit32(rest) + 1;
            if (verif != rest) return ERROR(corruption_detected);    /* last value must be a clean power of 2 */
            huffWeight[oSize] = (BYTE)lastWeight;
            rankStats[lastWeight]++;
    }   }

    /* check tree construction validity */
    if ((rankStats[1] < 2) || (rankStats[1] & 1)) return ERROR(corruption_detected);   /* by construction : at least 2 elts of rank 1, must be even */

    /* results */
    *nbSymbolsPtr = (U32)(oSize+1);
    return iSize+1;
}